

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_min_attribute.h
# Opt level: O2

void __thiscall
c74::min::
attribute<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>::
set(attribute<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>
    *this,atoms *args,bool notify,bool override_readonly)

{
  object_base *poVar1;
  bool bVar2;
  int iVar3;
  t_object *ptVar4;
  _Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_> _Stack_38;
  
  if ((byte)((this->super_attribute_base).m_readonly ^ 1U | override_readonly) == 1) {
    constrain<double,_0>((atoms *)&_Stack_38,this,args);
    bVar2 = compare_to_current_value(this,(atoms *)&_Stack_38);
    std::_Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>::~_Vector_base(&_Stack_38);
    if (!bVar2) {
      iVar3 = (*((this->super_attribute_base).m_owner)->_vptr_object_base[2])();
      if ((char)iVar3 == '\0') {
        attribute_threadsafe_helper<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>
        ::set(&this->m_helper,args);
      }
      else {
        attribute_threadsafe_helper_do_set<double,(c74::min::threadsafe)1,c74::min::limit::clamp,(c74::min::allow_repetitions)1>
                  (&this->m_helper,args);
      }
      if ((this->super_attribute_base).m_name.s == k_sym_value) {
        poVar1 = (this->super_attribute_base).m_owner;
        ptVar4 = (t_object *)0x0;
        if (poVar1->m_min_magic == 0x75a8ec37) {
          ptVar4 = poVar1->m_maxobj;
        }
        object_notify(ptVar4,k_sym_modified,0);
      }
    }
  }
  return;
}

Assistant:

bool writable() const
    {
        return !m_readonly;
    }